

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O2

void __thiscall
duckdb::DbpDecoder::GetBatch<int>(DbpDecoder *this,data_ptr_t target_values_ptr,idx_t batch_size)

{
  ulong uVar1;
  runtime_error *this_00;
  
  uVar1 = this->read_values + batch_size;
  if (uVar1 <= this->total_value_count) {
    this->read_values = uVar1;
    GetBatchInternal<int,false>(this,target_values_ptr,batch_size);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"DBP decode did not find enough values");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void GetBatch(const data_ptr_t target_values_ptr, const idx_t batch_size) {
		if (read_values + batch_size > total_value_count) {
			throw std::runtime_error("DBP decode did not find enough values");
		}
		read_values += batch_size;
		GetBatchInternal<T>(target_values_ptr, batch_size);
	}